

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode libcurl_generate_slist(curl_slist *slist,int *slistno)

{
  char *__ptr;
  char *escaped;
  CURLcode ret;
  int *slistno_local;
  curl_slist *slist_local;
  
  easysrc_slist_count = easysrc_slist_count + 1;
  *slistno = easysrc_slist_count;
  escaped._4_4_ = easysrc_addf(&easysrc_decl,"struct curl_slist *slist%d;",(ulong)(uint)*slistno);
  if (escaped._4_4_ == CURLE_OK) {
    escaped._4_4_ = easysrc_addf(&easysrc_data,"slist%d = NULL;",(ulong)(uint)*slistno);
  }
  if (escaped._4_4_ == CURLE_OK) {
    escaped._4_4_ =
         easysrc_addf(&easysrc_clean,"curl_slist_free_all(slist%d);",(ulong)(uint)*slistno);
  }
  if (escaped._4_4_ == CURLE_OK) {
    escaped._4_4_ = easysrc_addf(&easysrc_clean,"slist%d = NULL;",(ulong)(uint)*slistno);
  }
  slistno_local = (int *)slist;
  if (escaped._4_4_ == CURLE_OK) {
    for (; slistno_local != (int *)0x0 && escaped._4_4_ == CURLE_OK;
        slistno_local = *(int **)(slistno_local + 2)) {
      __ptr = c_escape(*(char **)slistno_local,-1);
      if (__ptr == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      escaped._4_4_ =
           easysrc_addf(&easysrc_data,"slist%d = curl_slist_append(slist%d, \"%s\");",
                        (ulong)(uint)*slistno,(ulong)(uint)*slistno,__ptr);
      free(__ptr);
    }
    slist_local._4_4_ = escaped._4_4_;
  }
  else {
    slist_local._4_4_ = escaped._4_4_;
  }
  return slist_local._4_4_;
}

Assistant:

static CURLcode libcurl_generate_slist(struct curl_slist *slist, int *slistno)
{
  CURLcode ret = CURLE_OK;

  /* May need several slist variables, so invent name */
  *slistno = ++easysrc_slist_count;

  ret = easysrc_addf(&easysrc_decl, "struct curl_slist *slist%d;", *slistno);
  if(!ret)
    ret = easysrc_addf(&easysrc_data, "slist%d = NULL;", *slistno);
  if(!ret)
    ret = easysrc_addf(&easysrc_clean, "curl_slist_free_all(slist%d);",
                       *slistno);
  if(!ret)
    ret = easysrc_addf(&easysrc_clean, "slist%d = NULL;", *slistno);
  if(ret)
    return ret;
  for(; slist && !ret; slist = slist->next) {
    char *escaped = c_escape(slist->data, ZERO_TERMINATED);
    if(!escaped)
      return CURLE_OUT_OF_MEMORY;
    ret = easysrc_addf(&easysrc_data,
                       "slist%d = curl_slist_append(slist%d, \"%s\");",
                       *slistno, *slistno, escaped);
    free(escaped);
  }

  return ret;
}